

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

half Imf_3_4::floatToHalf(float f)

{
  bool bVar1;
  half hVar2;
  float in_XMM0_Da;
  float fVar3;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  half in_stack_fffffffffffffff4;
  half in_stack_fffffffffffffff6;
  uint16_t local_2;
  
  bVar1 = anon_unknown_2::isFinite(in_XMM0_Da);
  if (bVar1) {
    in_stack_fffffffffffffff0 = in_XMM0_Da;
    in_stack_fffffffffffffff6 = std::numeric_limits<Imath_3_2::half>::max();
    fVar3 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT26(in_stack_fffffffffffffff6._h,
                                        CONCAT24(in_stack_fffffffffffffff4._h,
                                                 in_stack_fffffffffffffff0)));
    if (fVar3 < in_stack_fffffffffffffff0) {
      hVar2 = Imath_3_2::half::posInf();
      return (half)hVar2._h;
    }
    in_stack_fffffffffffffff4 = std::numeric_limits<Imath_3_2::half>::lowest();
    fVar3 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT26(in_stack_fffffffffffffff6._h,
                                        CONCAT24(in_stack_fffffffffffffff4._h,
                                                 in_stack_fffffffffffffff0)));
    in_stack_ffffffffffffffec = in_XMM0_Da;
    if (in_XMM0_Da < fVar3) {
      hVar2 = Imath_3_2::half::negInf();
      return (half)hVar2._h;
    }
  }
  Imath_3_2::half::half
            ((half *)CONCAT26(in_stack_fffffffffffffff6._h,
                              CONCAT24(in_stack_fffffffffffffff4._h,in_stack_fffffffffffffff0)),
             in_stack_ffffffffffffffec);
  return (half)local_2;
}

Assistant:

half
floatToHalf (float f)
{
    if (isFinite (f))
    {
        if (f > std::numeric_limits<half>::max ()) return half::posInf ();

        if (f < std::numeric_limits<half>::lowest ()) return half::negInf ();
    }

    return half (f);
}